

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vtls.c
# Opt level: O2

_Bool Curl_clone_primary_ssl_config(ssl_primary_config *source,ssl_primary_config *dest)

{
  byte bVar1;
  long lVar2;
  byte bVar3;
  byte bVar4;
  byte bVar5;
  _Bool _Var6;
  char *pcVar7;
  
  lVar2 = source->version_max;
  dest->version = source->version;
  dest->version_max = lVar2;
  bVar3 = source->field_0x48 & 1;
  bVar1 = dest->field_0x48;
  dest->field_0x48 = bVar1 & 0xfe | bVar3;
  bVar4 = source->field_0x48 & 2;
  dest->field_0x48 = bVar1 & 0xfc | bVar3 | bVar4;
  bVar5 = source->field_0x48 & 4;
  dest->field_0x48 = bVar1 & 0xf8 | bVar3 | bVar4 | bVar5;
  dest->field_0x48 = bVar1 & 0xf0 | bVar3 | bVar4 | bVar5 | source->field_0x48 & 8;
  if (source->CApath == (char *)0x0) {
    dest->CApath = (char *)0x0;
LAB_00466325:
    if (source->CAfile == (char *)0x0) {
      dest->CAfile = (char *)0x0;
    }
    else {
      pcVar7 = (*Curl_cstrdup)(source->CAfile);
      dest->CAfile = pcVar7;
      if (pcVar7 == (char *)0x0) goto LAB_004663f0;
    }
    if (source->clientcert == (char *)0x0) {
      dest->clientcert = (char *)0x0;
    }
    else {
      pcVar7 = (*Curl_cstrdup)(source->clientcert);
      dest->clientcert = pcVar7;
      if (pcVar7 == (char *)0x0) goto LAB_004663f0;
    }
    if (source->random_file == (char *)0x0) {
      dest->random_file = (char *)0x0;
    }
    else {
      pcVar7 = (*Curl_cstrdup)(source->random_file);
      dest->random_file = pcVar7;
      if (pcVar7 == (char *)0x0) goto LAB_004663f0;
    }
    if (source->egdsocket == (char *)0x0) {
      dest->egdsocket = (char *)0x0;
    }
    else {
      pcVar7 = (*Curl_cstrdup)(source->egdsocket);
      dest->egdsocket = pcVar7;
      if (pcVar7 == (char *)0x0) goto LAB_004663f0;
    }
    if (source->cipher_list == (char *)0x0) {
      dest->cipher_list = (char *)0x0;
    }
    else {
      pcVar7 = (*Curl_cstrdup)(source->cipher_list);
      dest->cipher_list = pcVar7;
      if (pcVar7 == (char *)0x0) goto LAB_004663f0;
    }
    if (source->cipher_list13 == (char *)0x0) {
      dest->cipher_list13 = (char *)0x0;
    }
    else {
      pcVar7 = (*Curl_cstrdup)(source->cipher_list13);
      dest->cipher_list13 = pcVar7;
      if (pcVar7 == (char *)0x0) goto LAB_004663f0;
    }
    _Var6 = true;
  }
  else {
    pcVar7 = (*Curl_cstrdup)(source->CApath);
    dest->CApath = pcVar7;
    if (pcVar7 != (char *)0x0) goto LAB_00466325;
LAB_004663f0:
    _Var6 = false;
  }
  return _Var6;
}

Assistant:

bool
Curl_clone_primary_ssl_config(struct ssl_primary_config *source,
                              struct ssl_primary_config *dest)
{
  dest->version = source->version;
  dest->version_max = source->version_max;
  dest->verifypeer = source->verifypeer;
  dest->verifyhost = source->verifyhost;
  dest->verifystatus = source->verifystatus;
  dest->sessionid = source->sessionid;

  CLONE_STRING(CApath);
  CLONE_STRING(CAfile);
  CLONE_STRING(clientcert);
  CLONE_STRING(random_file);
  CLONE_STRING(egdsocket);
  CLONE_STRING(cipher_list);
  CLONE_STRING(cipher_list13);

  return TRUE;
}